

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::grabMouse(QGraphicsScenePrivate *this,QGraphicsItem *item,bool implicit)

{
  long lVar1;
  QGraphicsItem *this_00;
  bool bVar2;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  QGraphicsItem *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = item;
  bVar2 = QListSpecialMethodsBase<QGraphicsItem*>::contains<QGraphicsItem*>
                    ((QListSpecialMethodsBase<QGraphicsItem*> *)&this->mouseGrabberItems,&local_38);
  if (bVar2) {
    if ((this->mouseGrabberItems).d.ptr[(this->mouseGrabberItems).d.size + -1] == local_38) {
      if ((*(uint *)&this->field_0xb8 >> 0xb & 1) == 0) {
        local_58 = 2;
        local_44 = 0;
        uStack_54 = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        uStack_48 = 0;
        local_40 = "default";
        QMessageLogger::warning
                  ((char *)&local_58,"QGraphicsItem::grabMouse: already a mouse grabber");
      }
      else {
        *(uint *)&this->field_0xb8 = *(uint *)&this->field_0xb8 & 0xfffff7ff;
      }
    }
    else {
      local_58 = 2;
      local_44 = 0;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      local_40 = "default";
      QMessageLogger::warning
                ((char *)&local_58,"QGraphicsItem::grabMouse: already blocked by mouse grabber: %p")
      ;
    }
  }
  else {
    lVar1 = (this->mouseGrabberItems).d.size;
    if (lVar1 != 0) {
      this_00 = (this->mouseGrabberItems).d.ptr[lVar1 + -1];
      if ((this->field_0xb9 & 8) == 0) {
        local_58 = 0xaaaaaaaa;
        uStack_54 = 0xaaaaaaaa;
        uStack_50 = 0xaaaaaaaa;
        uStack_4c = 0xaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_58,UngrabMouse);
        sendEvent(this,this_00,(QEvent *)&local_58);
        QEvent::~QEvent((QEvent *)&local_58);
      }
      else {
        QGraphicsItem::ungrabMouse(this_00);
      }
    }
    QList<QGraphicsItem_*>::append(&this->mouseGrabberItems,local_38);
    *(uint *)&this->field_0xb8 = *(uint *)&this->field_0xb8 & 0xfffff7ff | (uint)implicit << 0xb;
    local_58 = 0xaaaaaaaa;
    uStack_54 = 0xaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_58,GrabMouse);
    sendEvent(this,local_38,(QEvent *)&local_58);
    QEvent::~QEvent((QEvent *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::grabMouse(QGraphicsItem *item, bool implicit)
{
    // Append to list of mouse grabber items, and send a mouse grab event.
    if (mouseGrabberItems.contains(item)) {
        if (mouseGrabberItems.constLast() == item) {
            Q_ASSERT(!implicit);
            if (!lastMouseGrabberItemHasImplicitMouseGrab) {
                qWarning("QGraphicsItem::grabMouse: already a mouse grabber");
            } else {
                // Upgrade to an explicit mouse grab
                lastMouseGrabberItemHasImplicitMouseGrab = false;
            }
        } else {
            qWarning("QGraphicsItem::grabMouse: already blocked by mouse grabber: %p",
                     mouseGrabberItems.constLast());
        }
        return;
    }

    // Send ungrab event to the last grabber.
    if (!mouseGrabberItems.isEmpty()) {
        QGraphicsItem *last = mouseGrabberItems.constLast();
        if (lastMouseGrabberItemHasImplicitMouseGrab) {
            // Implicit mouse grab is immediately lost.
            last->ungrabMouse();
        } else {
            // Just send ungrab event to current grabber.
            QEvent ungrabEvent(QEvent::UngrabMouse);
            sendEvent(last, &ungrabEvent);
        }
    }

    mouseGrabberItems << item;
    lastMouseGrabberItemHasImplicitMouseGrab = implicit;

    // Send grab event to current grabber.
    QEvent grabEvent(QEvent::GrabMouse);
    sendEvent(item, &grabEvent);
}